

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

tmbstr prvTidyPutUTF8(tmbstr buf,uint c)

{
  int iVar1;
  int local_1c [2];
  int count;
  int err;
  uint c_local;
  tmbstr buf_local;
  
  local_1c[0] = 0;
  count = c;
  _err = buf;
  iVar1 = prvTidyEncodeCharToUTF8Bytes(c,buf,(TidyOutputSink *)0x0,local_1c);
  if (iVar1 != 0) {
    *_err = -0x11;
    _err[1] = -0x41;
    _err[2] = -0x43;
    local_1c[0] = 3;
  }
  return _err + local_1c[0];
}

Assistant:

tmbstr TY_(PutUTF8)( tmbstr buf, uint c )
{
    int err, count = 0;
        
    err = TY_(EncodeCharToUTF8Bytes)( c, buf, NULL, &count );
    if (err)
    {
#if 1 && defined(_DEBUG)
        fprintf(stderr, "pprint UTF-8 encoding error for U+%x : ", c);
#endif
        /* replacement char 0xFFFD encoded as UTF-8 */
        buf[0] = (byte) 0xEF;
        buf[1] = (byte) 0xBF;
        buf[2] = (byte) 0xBD;
        count = 3;
    }
    
    buf += count;
    return buf;
}